

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readSuperJournal(sqlite3_file *pJrnl,char *zSuper,u32 nSuper)

{
  int iVar1;
  u32 uVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  i64 szJ;
  u32 local_4c;
  undefined1 *local_48;
  u32 local_3c;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  *zSuper = '\0';
  iVar1 = (*pJrnl->pMethods->xFileSize)(pJrnl,(sqlite3_int64 *)&local_48);
  if (0xf < (long)local_48 && iVar1 == 0) {
    local_3c = 0xaaaaaaaa;
    iVar1 = read32bits(pJrnl,(i64)(local_48 + -0x10),&local_3c);
    uVar2 = local_3c;
    if (iVar1 == 0) {
      uVar4 = (ulong)local_3c;
      iVar1 = 0;
      if ((local_3c < nSuper) && (iVar1 = 0, uVar4 != 0 && (long)uVar4 <= (long)(local_48 + -0x10)))
      {
        local_4c = 0xaaaaaaaa;
        iVar1 = read32bits(pJrnl,(i64)(local_48 + -0xc),&local_4c);
        if ((iVar1 == 0) &&
           (((iVar1 = (*pJrnl->pMethods->xRead)(pJrnl,&local_38,8,(sqlite3_int64)(local_48 + -8)),
             iVar1 == 0 && (iVar1 = 0, local_38 == (undefined1 *)0xd763a120f905d5d9)) &&
            (iVar1 = (*pJrnl->pMethods->xRead)
                               (pJrnl,zSuper,uVar2,(sqlite3_int64)(local_48 + (-0x10 - uVar4))),
            iVar1 == 0)))) {
          uVar3 = 0;
          uVar2 = local_4c;
          do {
            uVar2 = uVar2 - (int)zSuper[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
          iVar1 = 0;
          if (uVar2 != 0) {
            uVar4 = 0;
          }
          zSuper[uVar4] = '\0';
          zSuper[(int)uVar4 + 1] = '\0';
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int readSuperJournal(sqlite3_file *pJrnl, char *zSuper, u32 nSuper){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of super-journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zSuper[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nSuper
   || len>szJ-16
   || len==0
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zSuper, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the super-journal name */
  for(u=0; u<len; u++){
    cksum -= zSuper[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the super-journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** super-journal filename.
    */
    len = 0;
  }
  zSuper[len] = '\0';
  zSuper[len+1] = '\0';

  return SQLITE_OK;
}